

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

int Sbd_ManMergeCuts(Sbd_Man_t *p,int Node)

{
  uint uVar1;
  undefined8 uVar2;
  Sbd_Par_t *pSVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Sbd_Man_t *p_00;
  uint uVar17;
  int *piVar18;
  uint uVar19;
  uint uVar20;
  int Cut1 [2];
  int Cut0 [2];
  int pCut01 [13];
  int pCut00 [13];
  int pCut10 [13];
  int pCut11 [13];
  int *local_170;
  int *local_168;
  int local_138;
  uint local_134;
  int local_130;
  uint local_12c;
  int local_128 [16];
  int local_e8 [16];
  int local_a8 [16];
  int local_68 [14];
  
  if ((Node < 0) || (p->pGia->nObjs <= Node)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar2 = *(undefined8 *)(p->pGia->pObjs + (uint)Node);
  uVar20 = (uint)uVar2 & 0x1fffffff;
  uVar5 = Node - uVar20;
  if (-1 < (int)uVar5) {
    uVar17 = p->vLutLevs->nSize;
    if ((int)uVar5 < (int)uVar17) {
      uVar19 = (uint)((ulong)uVar2 >> 0x20) & 0x1fffffff;
      uVar10 = Node - uVar19;
      piVar18 = p->vLutLevs->pArray;
      iVar14 = piVar18[uVar5];
      iVar14 = iVar14 + (uint)(iVar14 == 0);
      if ((-1 < (int)uVar10) && (uVar10 < uVar17)) {
        iVar15 = piVar18[uVar10];
        iVar15 = iVar15 + (uint)(iVar15 == 0);
        iVar11 = p->pPars->nLutSize + 1;
        uVar17 = iVar11 * uVar5;
        if (-1 < (int)uVar17) {
          uVar1 = p->vLutCuts->nSize;
          if ((((int)uVar17 < (int)uVar1) && (uVar12 = iVar11 * uVar10, -1 < (int)uVar12)) &&
             (uVar12 < uVar1)) {
            p_00 = (Sbd_Man_t *)p->vLutCuts->pArray;
            piVar18 = (int *)((long)p_00->vSims + (ulong)uVar17 * 4 + -0x38);
            piVar4 = (int *)((long)p_00->vSims + (ulong)uVar12 * 4 + -0x38);
            local_130 = 1;
            local_138 = 1;
            local_168 = local_68;
            local_134 = uVar10;
            local_12c = uVar5;
            iVar6 = Sbd_CutMergeSimple(p_00,piVar18,piVar4,local_168);
            iVar7 = Sbd_CutMergeSimple(p_00,&local_130,piVar4,local_128);
            local_170 = local_a8;
            iVar8 = Sbd_CutMergeSimple(p_00,piVar18,&local_138,local_170);
            iVar9 = Sbd_CutMergeSimple(p_00,&local_130,&local_138,local_e8);
            pSVar3 = p->pPars;
            iVar11 = pSVar3->nLutSize;
            iVar13 = iVar15;
            if (iVar15 < iVar14) {
              iVar13 = iVar14;
            }
            if (iVar11 < iVar6) {
              iVar13 = 1000000000;
            }
            iVar6 = iVar14 + 1;
            iVar16 = iVar15;
            if (iVar15 < iVar6) {
              iVar16 = iVar6;
            }
            if (iVar11 < iVar7) {
              iVar16 = 1000000000;
            }
            iVar15 = iVar15 + 1;
            if (iVar14 <= iVar15) {
              iVar14 = iVar15;
            }
            if (iVar11 < iVar8) {
              iVar14 = 1000000000;
            }
            if (iVar15 < iVar6) {
              iVar15 = iVar6;
            }
            if (iVar11 < iVar9) {
              iVar15 = 1000000000;
            }
            if ((iVar16 < iVar13) || ((iVar16 == iVar13 && (local_128[0] < local_68[0])))) {
              local_168 = local_128;
              iVar13 = iVar16;
            }
            if (iVar13 <= iVar14) {
              if (iVar14 == iVar13) {
                if (*local_168 <= local_a8[0]) {
                  local_170 = local_168;
                }
              }
              else {
                local_170 = local_168;
                iVar14 = iVar13;
              }
            }
            piVar18 = local_e8;
            iVar11 = iVar15;
            if (((iVar14 <= iVar15) && (piVar18 = local_170, iVar11 = iVar14, iVar15 == iVar14)) &&
               (piVar18 = local_e8, iVar11 = iVar15, *local_170 <= local_e8[0])) {
              piVar18 = local_170;
            }
            if (uVar19 == uVar20) {
              __assert_fail("iFan0 != iFan1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x6ad,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
            }
            if (p->vLutLevs->nSize <= Node) goto LAB_00545bbb;
            piVar4 = p->vLutLevs->pArray;
            if (piVar4[(uint)Node] != 0) {
              __assert_fail("Vec_IntEntry(p->vLutLevs, Node) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x6ae,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
            }
            piVar4[(uint)Node] = iVar11;
            iVar14 = pSVar3->nLutSize;
            if (iVar14 < *piVar18) {
              __assert_fail("pCutRes[0] <= p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x6b1,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
            }
            uVar5 = (iVar14 + 1) * Node;
            if ((-1 < (int)uVar5) && ((int)uVar5 < p->vLutCuts->nSize)) {
              memcpy(p->vLutCuts->pArray + uVar5,piVar18,(long)*piVar18 * 4 + 4);
              return (int)(iVar11 == 1);
            }
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
    }
  }
LAB_00545bbb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManMergeCuts( Sbd_Man_t * p, int Node )
{
    int pCut11[2*SBD_MAX_LUTSIZE+1];     
    int pCut01[2*SBD_MAX_LUTSIZE+1];     
    int pCut10[2*SBD_MAX_LUTSIZE+1];     
    int pCut00[2*SBD_MAX_LUTSIZE+1];     
    int iFan0   = Gia_ObjFaninId0( Gia_ManObj(p->pGia, Node), Node );
    int iFan1   = Gia_ObjFaninId1( Gia_ManObj(p->pGia, Node), Node );
    int Level0  = Vec_IntEntry( p->vLutLevs, iFan0 ) ? Vec_IntEntry( p->vLutLevs, iFan0 ) : 1;
    int Level1  = Vec_IntEntry( p->vLutLevs, iFan1 ) ? Vec_IntEntry( p->vLutLevs, iFan1 ) : 1;
    int * pCut0 = Sbd_ObjCut( p, iFan0 );
    int * pCut1 = Sbd_ObjCut( p, iFan1 );
    int Cut0[2] = {1, iFan0}; 
    int Cut1[2] = {1, iFan1}; 
    int nSize11 = Sbd_CutMergeSimple( p, pCut0, pCut1, pCut11 );
    int nSize01 = Sbd_CutMergeSimple( p,  Cut0, pCut1, pCut01 );
    int nSize10 = Sbd_CutMergeSimple( p, pCut0,  Cut1, pCut10 );
    int nSize00 = Sbd_CutMergeSimple( p,  Cut0,  Cut1, pCut00 );
    int Lev11   = nSize11 <= p->pPars->nLutSize ? Abc_MaxInt(Level0,   Level1)   : ABC_INFINITY;
    int Lev01   = nSize01 <= p->pPars->nLutSize ? Abc_MaxInt(Level0+1, Level1)   : ABC_INFINITY;
    int Lev10   = nSize10 <= p->pPars->nLutSize ? Abc_MaxInt(Level0,   Level1+1) : ABC_INFINITY;
    int Lev00   = nSize00 <= p->pPars->nLutSize ? Abc_MaxInt(Level0+1, Level1+1) : ABC_INFINITY;
    int * pCutRes = pCut11;
    int LevCur    = Lev11;
    if ( Lev01 < LevCur || (Lev01 == LevCur && pCut01[0] < pCutRes[0]) )
    {
        pCutRes = pCut01;
        LevCur  = Lev01;
    }
    if ( Lev10 < LevCur || (Lev10 == LevCur && pCut10[0] < pCutRes[0]) )
    {
        pCutRes = pCut10;
        LevCur  = Lev10;
    }
    if ( Lev00 < LevCur || (Lev00 == LevCur && pCut00[0] < pCutRes[0]) )
    {
        pCutRes = pCut00;
        LevCur  = Lev00;
    }
    assert( iFan0 != iFan1 );
    assert( Vec_IntEntry(p->vLutLevs, Node) == 0 );
    Vec_IntWriteEntry( p->vLutLevs, Node, LevCur );
    //Vec_IntWriteEntry( p->vLevs, Node, 1+Abc_MaxInt(Vec_IntEntry(p->vLevs, iFan0), Vec_IntEntry(p->vLevs, iFan1)) );
    assert( pCutRes[0] <= p->pPars->nLutSize );
    memcpy( Sbd_ObjCut(p, Node), pCutRes, sizeof(int) * (pCutRes[0] + 1) );
//printf( "Setting node %d with delay %d.\n", Node, LevCur );
    return LevCur == 1; // LevCur == Abc_MaxInt(Level0, Level1);
}